

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::ClosureTest_TestPermanentClosureMethod2_Test::
~ClosureTest_TestPermanentClosureMethod2_Test(ClosureTest_TestPermanentClosureMethod2_Test *this)

{
  ClosureTest::~ClosureTest(&this->super_ClosureTest);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(ClosureTest, TestPermanentClosureMethod2) {
  const char* cstr = "hello";
  Closure* closure = NewPermanentCallback(current_instance_,
                                          &ClosureTest::SetABMethod, 789, cstr);
  EXPECT_NE(789, a_);
  EXPECT_NE(cstr, b_);
  closure->Run();
  EXPECT_EQ(789, a_);
  EXPECT_EQ(cstr, b_);
  a_ = 0;
  b_ = nullptr;
  closure->Run();
  EXPECT_EQ(789, a_);
  EXPECT_EQ(cstr, b_);
  delete closure;
}